

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O2

void __thiscall
leveldb::Constructor::Finish
          (Constructor *this,Options *options,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keys,KVMap *kvmap)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr this_00;
  _Link_type __x;
  _Base_ptr p_Var2;
  Tester *this_01;
  Options *__x_00;
  Status s;
  Status local_1f8;
  string local_1f0;
  undefined1 local_1d0 [416];
  
  __x_00 = options;
  if (&this->data_ != kvmap) {
    local_1d0._0_8_ = (kvmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var2 = (kvmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
    if ((_Base_ptr)local_1d0._0_8_ == (_Base_ptr)0x0) {
      local_1d0._8_8_ = (_Base_ptr)0x0;
    }
    else {
      ((_Base_ptr)local_1d0._0_8_)->_M_parent = (_Base_ptr)0x0;
      local_1d0._8_8_ = p_Var2->_M_left;
      if ((_Base_ptr)local_1d0._8_8_ == (_Base_ptr)0x0) {
        local_1d0._8_8_ = p_Var2;
      }
    }
    __x_00 = (Options *)&(kvmap->_M_t)._M_impl.super__Rb_tree_header;
    (kvmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (kvmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)__x_00;
    (kvmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)__x_00;
    (kvmap->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    (kvmap->_M_t)._M_impl.super__Rb_tree_key_compare<leveldb::(anonymous_namespace)::STLLessThan>.
    _M_key_compare.cmp =
         (this->data_)._M_t._M_impl.
         super__Rb_tree_key_compare<leveldb::(anonymous_namespace)::STLLessThan>._M_key_compare.cmp;
    this_00 = (this->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_1d0._16_8_ = kvmap;
    if (this_00 != (_Base_ptr)0x0) {
      __x = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,leveldb::(anonymous_namespace)::STLLessThan,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::
            _M_copy<false,std::_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,leveldb::(anonymous_namespace)::STLLessThan,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::_Reuse_or_alloc_node>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,leveldb::(anonymous_namespace)::STLLessThan,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)this_00,(_Link_type)__x_00,(_Base_ptr)local_1d0,
                       (_Reuse_or_alloc_node *)p_Var2);
      p_Var2 = std::_Rb_tree_node_base::_S_minimum(&__x->super__Rb_tree_node_base);
      (kvmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = p_Var2;
      p_Var2 = std::_Rb_tree_node_base::_S_maximum(p_Var2);
      (kvmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = p_Var2;
      (kvmap->_M_t)._M_impl.super__Rb_tree_header._M_node_count =
           (this->data_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      (kvmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
           &__x->super__Rb_tree_node_base;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_leveldb::(anonymous_namespace)::STLLessThan,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Reuse_or_alloc_node::~_Reuse_or_alloc_node((_Reuse_or_alloc_node *)local_1d0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(keys);
  p_Var1 = &(this->data_)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var2 = (this->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != p_Var1; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    __x_00 = (Options *)(p_Var2 + 1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(keys,(value_type *)__x_00);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_leveldb::(anonymous_namespace)::STLLessThan,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_leveldb::(anonymous_namespace)::STLLessThan,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(this->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
             (_Link_type)__x_00);
  (this->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->data_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (*this->_vptr_Constructor[2])(&local_1f8,this,options,kvmap);
  test::Tester::Tester
            ((Tester *)local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
             ,0xa0);
  this_01 = test::Tester::Is((Tester *)local_1d0,local_1f8.state_ == (char *)0x0,"s.ok()");
  Status::ToString_abi_cxx11_(&local_1f0,&local_1f8);
  test::Tester::operator<<(this_01,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  test::Tester::~Tester((Tester *)local_1d0);
  Status::~Status(&local_1f8);
  return;
}

Assistant:

void Finish(const Options& options, std::vector<std::string>* keys,
              KVMap* kvmap) {
    *kvmap = data_;
    keys->clear();
    for (const auto& kvp : data_) {
      keys->push_back(kvp.first);
    }
    data_.clear();
    Status s = FinishImpl(options, *kvmap);
    ASSERT_TRUE(s.ok()) << s.ToString();
  }